

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O2

void __thiscall
llvm::SmallVectorTemplateBase<llvm::DWARFDebugLoc::LocationList,_false>::grow
          (SmallVectorTemplateBase<llvm::DWARFDebugLoc::LocationList,_false> *this,size_t MinSize)

{
  move_iterator<llvm::DWARFDebugLoc::LocationList_*> __first;
  LocationList *S;
  SmallVectorTemplateBase<llvm::DWARFDebugLoc::LocationList,_false> *__ptr;
  uint64_t uVar1;
  LocationList *__result;
  
  if (MinSize >> 0x20 != 0) {
    report_bad_alloc_error("SmallVector capacity overflow during allocation",true);
  }
  uVar1 = NextPowerOf2((ulong)(this->
                              super_SmallVectorTemplateCommon<llvm::DWARFDebugLoc::LocationList,_void>
                              ).super_SmallVectorBase.Capacity + 2);
  if (MinSize < uVar1) {
    MinSize = uVar1;
  }
  if (0xfffffffe < MinSize) {
    MinSize = 0xffffffff;
  }
  __result = (LocationList *)safe_malloc(MinSize * 0x68);
  __first._M_current =
       (LocationList *)
       (this->super_SmallVectorTemplateCommon<llvm::DWARFDebugLoc::LocationList,_void>).
       super_SmallVectorBase.BeginX;
  std::__uninitialized_copy<false>::
  __uninit_copy<std::move_iterator<llvm::DWARFDebugLoc::LocationList*>,llvm::DWARFDebugLoc::LocationList*>
            (__first,__first._M_current +
                     (this->super_SmallVectorTemplateCommon<llvm::DWARFDebugLoc::LocationList,_void>
                     ).super_SmallVectorBase.Size,__result);
  S = (LocationList *)
      (this->super_SmallVectorTemplateCommon<llvm::DWARFDebugLoc::LocationList,_void>).
      super_SmallVectorBase.BeginX;
  destroy_range(S,S + (this->
                      super_SmallVectorTemplateCommon<llvm::DWARFDebugLoc::LocationList,_void>).
                      super_SmallVectorBase.Size);
  __ptr = (SmallVectorTemplateBase<llvm::DWARFDebugLoc::LocationList,_false> *)
          (this->super_SmallVectorTemplateCommon<llvm::DWARFDebugLoc::LocationList,_void>).
          super_SmallVectorBase.BeginX;
  if (__ptr != this + 1) {
    free(__ptr);
  }
  (this->super_SmallVectorTemplateCommon<llvm::DWARFDebugLoc::LocationList,_void>).
  super_SmallVectorBase.BeginX = __result;
  (this->super_SmallVectorTemplateCommon<llvm::DWARFDebugLoc::LocationList,_void>).
  super_SmallVectorBase.Capacity = (uint)MinSize;
  return;
}

Assistant:

void SmallVectorTemplateBase<T, TriviallyCopyable>::grow(size_t MinSize) {
  if (MinSize > UINT32_MAX)
    report_bad_alloc_error("SmallVector capacity overflow during allocation");

  // Always grow, even from zero.
  size_t NewCapacity = size_t(NextPowerOf2(this->capacity() + 2));
  NewCapacity = std::min(std::max(NewCapacity, MinSize), size_t(UINT32_MAX));
  T *NewElts = static_cast<T*>(llvm::safe_malloc(NewCapacity*sizeof(T)));

  // Move the elements over.
  this->uninitialized_move(this->begin(), this->end(), NewElts);

  // Destroy the original elements.
  destroy_range(this->begin(), this->end());

  // If this wasn't grown from the inline copy, deallocate the old space.
  if (!this->isSmall())
    free(this->begin());

  this->BeginX = NewElts;
  this->Capacity = NewCapacity;
}